

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extra_drop_info.cpp
# Opt level: O3

unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>,_true> __thiscall
duckdb::ExtraDropInfo::Deserialize(ExtraDropInfo *this,Deserializer *deserializer)

{
  ExtraDropInfoType EVar1;
  int iVar2;
  SerializationException *this_00;
  pointer *__ptr;
  string str;
  undefined1 local_48 [32];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"info_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    EVar1 = EnumUtil::FromString<duckdb::ExtraDropInfoType>((char *)local_48._0_8_);
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    EVar1 = (ExtraDropInfoType)iVar2;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  if (EVar1 == SECRET_INFO) {
    ExtraDropSecretInfo::Deserialize((ExtraDropSecretInfo *)local_48,deserializer);
    this->_vptr_ExtraDropInfo = (_func_int **)local_48._0_8_;
    return (unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)
           (unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)this;
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  local_48._0_8_ = local_48 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Unsupported type for deserialization of ExtraDropInfo!","");
  SerializationException::SerializationException(this_00,(string *)local_48);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ExtraDropInfo> ExtraDropInfo::Deserialize(Deserializer &deserializer) {
	auto info_type = deserializer.ReadProperty<ExtraDropInfoType>(100, "info_type");
	unique_ptr<ExtraDropInfo> result;
	switch (info_type) {
	case ExtraDropInfoType::SECRET_INFO:
		result = ExtraDropSecretInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ExtraDropInfo!");
	}
	return result;
}